

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * __thiscall
cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmSystemTools *this,char *fname,char *directory,
          char *toplevel)

{
  bool bVar1;
  char *filename;
  ulong uVar2;
  size_t sVar3;
  allocator local_f9;
  string local_f8;
  int local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  byte local_a9;
  undefined1 local_a8 [8];
  string prevDir;
  undefined1 local_80 [8];
  string dir;
  allocator local_49;
  undefined1 local_48 [8];
  string file;
  char *toplevel_local;
  char *directory_local;
  char *fname_local;
  string *path;
  
  file.field_2._8_8_ = directory;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,(char *)this,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,fname,(allocator *)(prevDir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(prevDir.field_2._M_local_buf + 0xf));
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_80);
  std::__cxx11::string::string((string *)local_a8);
  do {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_a8);
    if (!bVar1) goto LAB_0057c57f;
    local_a9 = 0;
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,"/"
                  );
    std::operator+(__return_storage_ptr__,&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)&local_d0);
    filename = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(filename);
    if (bVar1) {
      local_a9 = 1;
      local_d4 = 1;
    }
    else {
      uVar2 = std::__cxx11::string::size();
      sVar3 = strlen((char *)file.field_2._8_8_);
      if (uVar2 < sVar3) {
        local_d4 = 3;
      }
      else {
        std::__cxx11::string::operator=((string *)local_a8,(string *)local_80);
        cmsys::SystemTools::GetParentDirectory(&local_f8,(string *)local_80);
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        local_d4 = 0;
      }
    }
    if ((local_a9 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  } while (local_d4 == 0);
  if (local_d4 == 3) {
LAB_0057c57f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    local_d4 = 1;
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(const char* fname,
                                                         const char* directory,
                                                         const char* toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while (dir != prevDir) {
    std::string path = dir + "/" + file;
    if (cmSystemTools::FileExists(path.c_str())) {
      return path;
    }
    if (dir.size() < strlen(toplevel)) {
      break;
    }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
  }
  return "";
}